

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  Object *pOVar2;
  Object *pOVar3;
  Array *pAVar4;
  Json js;
  Json json1;
  ifstream file;
  bool local_4a9;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  Array local_3a8;
  Array local_388;
  Object local_368;
  Object local_330;
  Json local_2f8;
  undefined4 local_298;
  undefined **local_290;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
  local_288;
  undefined **local_258;
  vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_> local_250;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,"../test.json",_S_in);
  json::Json::Json(&local_2f8,local_238);
  local_288._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288._M_impl.super__Rb_tree_header._M_header;
  local_298 = 0;
  local_290 = &PTR_clone_00128c98;
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258 = &PTR_clone_00128cd0;
  local_250.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_250.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_250.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288._M_impl.super__Rb_tree_header._M_header._M_left;
  poVar1 = json::operator<<((ostream *)&std::cout,&local_2f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_330.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_330.fields._M_t._M_impl.super__Rb_tree_header._M_header;
  local_330.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  local_330.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_330.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_330.fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_330.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_330.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Test String","");
  local_368.super_Type._vptr_Type = (_func_int **)0x1210c0;
  pOVar2 = json::Object::add<json::String,char_const*>(&local_330,&local_408,(char **)&local_368);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Test object","");
  local_368.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_368.fields._M_t._M_impl.super__Rb_tree_header._M_header;
  local_368.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  local_368.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_368.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_368.fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_368.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_368.fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Foo","");
  local_468._M_dataplus._M_p = (pointer)0x20;
  pOVar3 = json::Object::add<json::Integer,long>(&local_368,&local_448,(long *)&local_468);
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Bar","");
  local_3a8.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  local_3a8.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488._M_dataplus._M_p = (pointer)0x234;
  pAVar4 = json::Array::add<json::Integer,long>(&local_3a8,(long *)&local_488);
  local_488._M_dataplus._M_p = "Test";
  pAVar4 = json::Array::add<json::String,char_const*>(pAVar4,(char **)&local_488);
  pOVar3 = json::Object::add<json::Array,json::Array>(pOVar3,&local_468,pAVar4);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Quuz","");
  local_388.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  local_388.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.fields.
  super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8._M_dataplus._M_p = (pointer)0x2a;
  pAVar4 = json::Array::add<json::Integer,long>(&local_388,(long *)&local_4a8);
  local_4a8._M_dataplus._M_p = local_4a8._M_dataplus._M_p & 0xffffffffffffff00;
  pAVar4 = json::Array::add<json::Bool,bool>(pAVar4,(bool *)&local_4a8);
  pOVar3 = json::Object::add<json::Array,json::Array>(pOVar3,&local_488,pAVar4);
  pOVar2 = json::Object::add<json::Object,json::Object>(pOVar2,&local_428,pOVar3);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Test Integer","");
  local_3c8._M_dataplus._M_p = (pointer)0x2a;
  pOVar2 = json::Object::add<json::Integer,long>(pOVar2,&local_4a8,(long *)&local_3c8);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Test Float","");
  local_3e8._M_dataplus._M_p = (pointer)0x400921cac083126f;
  pOVar2 = json::Object::add<json::Float,double>(pOVar2,&local_3c8,(double *)&local_3e8);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Test Bool","");
  local_4a9 = false;
  pOVar2 = json::Object::add<json::Bool,bool>(pOVar2,&local_3e8,&local_4a9);
  poVar1 = json::operator<<((ostream *)&std::cout,pOVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  local_388.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
  ~vector(&local_388.fields);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  local_3a8.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
  ~vector(&local_3a8.fields);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_368.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
  ::~_Rb_tree(&local_368.fields._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  local_330.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
  ::~_Rb_tree(&local_330.fields._M_t);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  local_258 = &PTR_clone_00128cd0;
  std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
  ~vector(&local_250);
  local_290 = &PTR_clone_00128c98;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
  ::~_Rb_tree(&local_288);
  local_2f8.array.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128cd0;
  std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
  ~vector(&local_2f8.array.fields);
  local_2f8.object.super_Type._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
  ::~_Rb_tree(&local_2f8.object.fields._M_t);
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main() {
    try {

        // Сделать ещё парсер yaml

        std::ifstream file("../test.json");
        json::Json js(file);
        json::Json json1;
        std::cout << js << std::endl;

        std::cout << json::Object()
                ("Test String", "string")
                ("Test object", json::Object()
                        ("Foo", 32)
                        ("Bar", json::Array()
                                (564)
                                ("Test")
                        )
                        ("Quuz", json::Array()
                                (42)
                                (false)
                        )
                )
                ("Test Integer", 42)
                ("Test Float", 3.1415)
                ("Test Bool", false) << std::endl;

        std::cout << std::endl;
   	}
    catch (std::exception const& e) {
        std::cerr << e.what() << std::endl;
    }
}